

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O3

void __thiscall
cbtBoxShape::getPreferredPenetrationDirection
          (cbtBoxShape *this,int index,cbtVector3 *penetrationVector)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  ulong uVar3;
  
  if ((uint)index < 6) {
    uVar3 = (ulong)(uint)index;
    cVar1 = *(cbtScalar *)(&DAT_009ed940 + uVar3 * 4);
    cVar2 = *(cbtScalar *)(&DAT_009ed958 + uVar3 * 4);
    penetrationVector->m_floats[0] = *(cbtScalar *)(&DAT_009ed928 + uVar3 * 4);
    penetrationVector->m_floats[1] = cVar1;
    penetrationVector->m_floats[2] = cVar2;
    penetrationVector->m_floats[3] = 0.0;
  }
  return;
}

Assistant:

virtual void getPreferredPenetrationDirection(int index, cbtVector3& penetrationVector) const
	{
		switch (index)
		{
			case 0:
				penetrationVector.setValue(cbtScalar(1.), cbtScalar(0.), cbtScalar(0.));
				break;
			case 1:
				penetrationVector.setValue(cbtScalar(-1.), cbtScalar(0.), cbtScalar(0.));
				break;
			case 2:
				penetrationVector.setValue(cbtScalar(0.), cbtScalar(1.), cbtScalar(0.));
				break;
			case 3:
				penetrationVector.setValue(cbtScalar(0.), cbtScalar(-1.), cbtScalar(0.));
				break;
			case 4:
				penetrationVector.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(1.));
				break;
			case 5:
				penetrationVector.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(-1.));
				break;
			default:
				cbtAssert(0);
		}
	}